

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O3

UINT8 adlib_OPL2_reg_read(void *chip,UINT8 port)

{
  byte bVar1;
  
  bVar1 = 0xff;
  if ((port & 1) == 0) {
    bVar1 = *(byte *)((long)chip + 0xc81) | 6;
  }
  return bVar1;
}

Assistant:

UINT8 ADLIBEMU(reg_read)(void *chip, UINT8 port)
{
	OPL_DATA* OPL = (OPL_DATA*)chip;
	
#if defined(OPLTYPE_IS_OPL3)
	// opl3-detection routines require ret&6 to be zero
	if ((port&3)==0)
	{
		return OPL->status;
	}
	return 0x00;
#else
	// opl2-detection routines require ret&6 to be 6
	if ((port&1)==0)
	{
		return OPL->status|6;
	}
	return 0xff;
#endif
}